

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

Char * Diligent::GetComparisonFunctionLiteralName
                 (COMPARISON_FUNCTION ComparisonFunc,bool bGetFullName)

{
  char *pcVar1;
  char *pcVar2;
  undefined7 in_register_00000039;
  char (*in_R8) [2];
  string msg;
  uint local_2c;
  string local_28;
  
  switch(CONCAT71(in_register_00000039,ComparisonFunc) & 0xffffffff) {
  case 0:
    pcVar2 = "COMPARISON_FUNC_UNKNOWN";
    pcVar1 = "unknown";
    break;
  case 1:
    pcVar2 = "COMPARISON_FUNC_NEVER";
    pcVar1 = "never";
    break;
  case 2:
    pcVar2 = "COMPARISON_FUNC_LESS";
    pcVar1 = "less";
    break;
  case 3:
    pcVar2 = "COMPARISON_FUNC_EQUAL";
    pcVar1 = "equal";
    break;
  case 4:
    pcVar2 = "COMPARISON_FUNC_LESS_EQUAL";
    pcVar1 = "less equal";
    break;
  case 5:
    pcVar2 = "COMPARISON_FUNC_GREATER";
    pcVar1 = "greater";
    break;
  case 6:
    pcVar2 = "COMPARISON_FUNC_NOT_EQUAL";
    pcVar1 = "not equal";
    break;
  case 7:
    pcVar2 = "COMPARISON_FUNC_GREATER_EQUAL";
    pcVar1 = "greater equal";
    break;
  case 8:
    pcVar2 = "COMPARISON_FUNC_ALWAYS";
    pcVar1 = "always";
    break;
  default:
    local_2c = (uint)ComparisonFunc;
    FormatString<char[33],unsigned_int,char[2]>
              (&local_28,(Diligent *)"Unexpected comparison function (",(char (*) [33])&local_2c,
               (uint *)0x73bf31,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetComparisonFunctionLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x3b3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return "UNKNOWN";
  }
  if (bGetFullName) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const Char* GetComparisonFunctionLiteralName(COMPARISON_FUNCTION ComparisonFunc, bool bGetFullName)
{
    static_assert(COMPARISON_FUNC_NUM_FUNCTIONS == 9, "Please update the switch below to handle the new comparison function");
    switch (ComparisonFunc)
    {
        // clang-format off
        case COMPARISON_FUNC_UNKNOWN:       return bGetFullName ? "COMPARISON_FUNC_UNKNOWN"      : "unknown";
        case COMPARISON_FUNC_NEVER:         return bGetFullName ? "COMPARISON_FUNC_NEVER"        : "never";
        case COMPARISON_FUNC_LESS:          return bGetFullName ? "COMPARISON_FUNC_LESS"         : "less";
        case COMPARISON_FUNC_EQUAL:         return bGetFullName ? "COMPARISON_FUNC_EQUAL"        : "equal";
        case COMPARISON_FUNC_LESS_EQUAL:    return bGetFullName ? "COMPARISON_FUNC_LESS_EQUAL"   : "less equal";
        case COMPARISON_FUNC_GREATER:       return bGetFullName ? "COMPARISON_FUNC_GREATER"      : "greater";
        case COMPARISON_FUNC_NOT_EQUAL:     return bGetFullName ? "COMPARISON_FUNC_NOT_EQUAL"    : "not equal";
        case COMPARISON_FUNC_GREATER_EQUAL: return bGetFullName ? "COMPARISON_FUNC_GREATER_EQUAL": "greater equal";
        case COMPARISON_FUNC_ALWAYS:        return bGetFullName ? "COMPARISON_FUNC_ALWAYS"       : "always";
        // clang-format on
        default:
            UNEXPECTED("Unexpected comparison function (", Uint32{ComparisonFunc}, ")");
            return "UNKNOWN";
    }
}